

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

BinarySequenceExprSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::BinarySequenceExprSyntax,slang::syntax::SyntaxKind&,slang::syntax::SequenceExprSyntax&,slang::parsing::Token&,slang::syntax::SequenceExprSyntax&>
          (BumpAllocator *this,SyntaxKind *args,SequenceExprSyntax *args_1,Token *args_2,
          SequenceExprSyntax *args_3)

{
  Token op;
  BinarySequenceExprSyntax *pBVar1;
  BinarySequenceExprSyntax *in_RCX;
  undefined8 in_RDX;
  Info *in_RSI;
  BumpAllocator *in_R8;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  
  pBVar1 = (BinarySequenceExprSyntax *)
           allocate(in_R8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  op.info = in_RSI;
  op.kind = (short)in_RDX;
  op._2_1_ = (char)((ulong)in_RDX >> 0x10);
  op.numFlags.raw = (char)((ulong)in_RDX >> 0x18);
  op.rawLen = (int)((ulong)in_RDX >> 0x20);
  slang::syntax::BinarySequenceExprSyntax::BinarySequenceExprSyntax
            (in_RCX,(SyntaxKind)((ulong)in_R8 >> 0x20),
             (SequenceExprSyntax *)(in_RCX->super_SequenceExprSyntax).super_SyntaxNode.parent,op,
             *(SequenceExprSyntax **)&(in_RCX->super_SequenceExprSyntax).super_SyntaxNode);
  return pBVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }